

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O2

bool Function_Template::form5_Histogram(HistogramForm5 Histogram)

{
  uint *puVar1;
  byte value;
  bool bVar2;
  uint uVar3;
  Image mask;
  Image image;
  vector<unsigned_int,_std::allocator<unsigned_int>_> histogram;
  
  value = Unit_Test::intensityValue();
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate(&mask,0,0,'\x01','\x01');
  Test_Helper::uniformImage(&image,value,0,0,&mask);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate(&mask);
  bVar2 = true;
  if (1 < image._height) {
    PenguinV_Image::ImageTemplate<unsigned_char>::generate
              (&mask,&image,image._width,image._height,image._colorCount,'\x01');
    Unit_Test::fillImage(&mask,0,0,mask._width,mask._height >> 1,0xff);
    Unit_Test::fillImage
              (&mask,0,mask._height >> 1,mask._width,mask._height - (mask._height >> 1),'\0');
    (*Histogram)(&histogram,&image,&mask);
    if ((long)histogram.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)histogram.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start == 0x400) {
      puVar1 = histogram.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start + value;
      uVar3 = 0;
      if (*puVar1 == (image._height >> 1) * image._width) {
        for (; histogram.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start !=
               histogram.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish;
            histogram.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start =
                 histogram.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start + 1) {
          uVar3 = uVar3 + *histogram.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                           ._M_impl.super__Vector_impl_data._M_start;
        }
        uVar3 = (uint)(uVar3 == *puVar1);
      }
    }
    else {
      uVar3 = 0;
    }
    bVar2 = SUB41(uVar3,0);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&histogram.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate(&mask);
  }
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate(&image);
  return bVar2;
}

Assistant:

bool form5_Histogram(HistogramForm5 Histogram)
    {
        const uint8_t intensity = intensityValue();
        const PenguinV_Image::Image image = uniformImage( intensity );

        if ( image.height() / 2 == 0 )
            return true;

        PenguinV_Image::Image mask = image.generate( image.width(), image.height(), image.colorCount() );
        fillImage( mask, 0, 0, mask.width(), mask.height() / 2, 255 );
        fillImage( mask, 0, mask.height() / 2, mask.width(), mask.height() - mask.height() / 2, 0 );

        const std::vector < uint32_t > histogram = Histogram( image, mask );

        return histogram.size() == 256u && histogram[intensity] == image.width() * (image.height() / 2) &&
            std::accumulate( histogram.begin(), histogram.end(), 0u ) == image.width() * (image.height() / 2);
    }